

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O2

void sha1_sw_digest(ssh_hash *hash,uint8_t *digest)

{
  uint uVar1;
  ssh_hashalg *psVar2;
  size_t i;
  long lVar3;
  uchar val;
  BinarySink *bs;
  ulong uVar4;
  bool bVar5;
  
  psVar2 = hash[-2].vt;
  bs = hash[-1].binarysink_;
  uVar4 = (ulong)(0x37U - *(int *)&hash[-3].binarysink_ & 0x3f);
  val = 0x80;
  while( true ) {
    BinarySink_put_byte(bs,val);
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) break;
    bs = hash[-1].binarysink_;
    val = '\0';
  }
  BinarySink_put_uint64(hash[-1].binarysink_,(long)psVar2 << 3);
  if (hash[-3].binarysink_ == (BinarySink *)0x0) {
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      uVar1 = *(uint *)((long)&hash[-8].vt + lVar3 * 4);
      *(uint *)(digest + lVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1.h",
                0x6c,"void sha1_block_pad(sha1_block *, BinarySink *)");
}

Assistant:

static void sha1_sw_digest(ssh_hash *hash, uint8_t *digest)
{
    sha1_sw *s = container_of(hash, sha1_sw, hash);

    sha1_block_pad(&s->blk, BinarySink_UPCAST(s));
    for (size_t i = 0; i < 5; i++)
        PUT_32BIT_MSB_FIRST(digest + 4*i, s->core[i]);
}